

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob)

{
  bool bVar1;
  float *pfVar2;
  int *piVar3;
  long *in_RSI;
  long in_RDI;
  int in_x;
  int x;
  int in_y;
  int y;
  float *output_ptr;
  float *ptr_1;
  int q_1;
  float *ptr;
  Mat top_blob_c;
  int q;
  int ow;
  int oh;
  int c;
  int w;
  int h;
  Mat *in_stack_fffffffffffffec0;
  Mat *in_stack_fffffffffffffec8;
  Mat *in_stack_fffffffffffffed0;
  Mat *pMVar4;
  undefined8 in_stack_fffffffffffffed8;
  Mat *in_stack_fffffffffffffee0;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Mat *in_stack_ffffffffffffff38;
  Mat *in_stack_ffffffffffffff40;
  Mat local_b8;
  float *local_88;
  int local_80;
  long local_70;
  int local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  uint local_28;
  uint local_24;
  long *local_18;
  int local_4;
  
  local_24 = *(uint *)(in_RSI + 4);
  local_28 = *(uint *)((long)in_RSI + 0x1c);
  local_2c = *(int *)((long)in_RSI + 0x24);
  local_30 = *(uint *)(in_RDI + 0x8c);
  local_34 = *(uint *)(in_RDI + 0x88);
  if ((int)in_RSI[3] == 1) {
    local_24 = 1;
    local_28 = 1;
    local_2c = *(int *)((long)in_RSI + 0x1c);
  }
  if ((local_30 == 0) || (local_34 == 0)) {
    local_30 = (uint)((float)(int)local_24 * *(float *)(in_RDI + 0x84));
    local_34 = (uint)((float)(int)local_28 * *(float *)(in_RDI + 0x80));
  }
  if ((local_30 == local_24) && (local_34 == local_28)) {
    Mat::operator=(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    Mat::create(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                (int)in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                (size_t)in_stack_fffffffffffffec8);
    bVar1 = Mat::empty(in_stack_fffffffffffffec0);
    if (bVar1) {
      local_4 = -100;
    }
    else if ((int)local_18[3] == 1) {
      for (local_38 = 0; local_38 < local_2c; local_38 = local_38 + 1) {
        Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        local_70 = *local_18 + (long)local_38 * 4;
        Mat::fill(in_stack_fffffffffffffed0,(float)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        Mat::~Mat((Mat *)0x14c419);
      }
      local_4 = 0;
    }
    else if (*(int *)(in_RDI + 0x90) == 1) {
      for (local_80 = 0; local_80 < local_2c; local_80 = local_80 + 1) {
        pMVar4 = &local_b8;
        Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(pMVar4);
        Mat::~Mat((Mat *)0x14c4d5);
        in_stack_fffffffffffffec0 = (Mat *)&stack0xffffffffffffff10;
        local_88 = pfVar2;
        Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        in_stack_fffffffffffffec8 = (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffffec0);
        Mat::~Mat((Mat *)0x14c51b);
        pMVar4 = in_stack_fffffffffffffec8;
        for (local_f4 = 0; local_f4 < (int)local_30; local_f4 = local_f4 + 1) {
          local_fc = (int)((float)local_f4 / *(float *)(in_RDI + 0x84));
          local_100 = local_24 - 1;
          piVar3 = std::min<int>(&local_fc,&local_100);
          local_f8 = *piVar3;
          for (local_104 = 0; local_104 < (int)local_34; local_104 = local_104 + 1) {
            local_10c = (int)((float)local_104 / *(float *)(in_RDI + 0x80));
            local_110 = local_28 - 1;
            piVar3 = std::min<int>(&local_10c,&local_110);
            local_108 = *piVar3;
            *(float *)((long)&pMVar4->data + (long)(int)(local_34 * local_f4 + local_104) * 4) =
                 local_88[(int)(local_f8 * local_28 + local_108)];
          }
        }
      }
      local_4 = 0;
    }
    else if (*(int *)(in_RDI + 0x90) == 2) {
      resize_bilinear(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                      in_stack_ffffffffffffff30);
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)*(uint *)(in_RDI + 0x90),
              (ulong)local_30,(ulong)local_34);
      local_4 = -0xe9;
    }
  }
  return local_4;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}